

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

ListNode * get_allocated_blocks_list(void)

{
  ListNode *pLVar1;
  long lVar2;
  long *in_FS_OFFSET;
  
  lVar2 = *in_FS_OFFSET;
  pLVar1 = (ListNode *)(lVar2 + -0x38);
  if (pLVar1->value == (void *)0x0) {
    *(ListNode **)(lVar2 + -0x28) = pLVar1;
    *(ListNode **)(lVar2 + -0x20) = pLVar1;
    *(undefined4 *)(lVar2 + -0x30) = 1;
    pLVar1->value = (void *)0x1;
  }
  return pLVar1;
}

Assistant:

static ListNode* get_allocated_blocks_list(void) {
    /* If it initialized, initialize the list of allocated blocks. */
    if (!global_allocated_blocks.value) {
        list_initialize(&global_allocated_blocks);
        global_allocated_blocks.value = (void*)1;
    }
    return &global_allocated_blocks;
}